

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O0

void obx::internal::throwLastError(obx_err err,char *contextPrefix)

{
  char *pcVar1;
  IllegalStateException *this;
  string local_38 [8];
  string msg;
  char *contextPrefix_local;
  obx_err err_local;
  
  std::__cxx11::string::string(local_38);
  if (contextPrefix != (char *)0x0) {
    pcVar1 = (char *)std::__cxx11::string::append((char *)local_38);
    std::__cxx11::string::append(pcVar1);
  }
  if (err == 0) {
    std::__cxx11::string::operator+=(local_38,"No error occurred (operation was successful)");
    this = (IllegalStateException *)__cxa_allocate_exception(0x10);
    IllegalStateException::runtime_error(this,(string *)local_38);
    __cxa_throw(this,&IllegalStateException::typeinfo,IllegalStateException::~IllegalStateException)
    ;
  }
  appendLastErrorText(err,(string *)local_38);
  throwError(err,(string *)local_38);
}

Assistant:

[[noreturn]] void throwLastError(obx_err err, const char* contextPrefix) {
    std::string msg;
    if (contextPrefix) msg.append(contextPrefix).append(": ");

    if (err == OBX_SUCCESS) {  // Zero, there's no error actually: this is atypical corner case, which should be avoided
        msg += "No error occurred (operation was successful)";
        throw IllegalStateException(msg);
    } else {
        appendLastErrorText(err, msg);
        throwError(err, msg);
    }
}